

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug-test.c++
# Opt level: O2

void __thiscall
kj::_::anon_unknown_0::MockExceptionCallback::onRecoverableException
          (MockExceptionCallback *this,Exception *exception)

{
  string *this_00;
  char *__last;
  Exception *params;
  String what;
  
  this_00 = &this->text;
  ::std::__cxx11::string::append((char *)this_00);
  str<kj::Exception&>(&what,(kj *)exception,params);
  if (what.content.size_ == 0) {
    what.content.ptr = "";
  }
  __last = strstr(what.content.ptr,"\nstack: ");
  if (__last == (char *)0x0) {
    ::std::__cxx11::string::append((char *)this_00);
  }
  else {
    ::std::__cxx11::string::append<char_const*,void>((string *)this_00,what.content.ptr,__last);
  }
  ::std::__cxx11::string::push_back((char)this_00);
  flush(this);
  Array<char>::~Array(&what.content);
  return;
}

Assistant:

void onRecoverableException(Exception&& exception) override {
    text += "recoverable exception: ";
    auto what = str(exception);
    // Discard the stack trace.
    const char* end = strstr(what.cStr(), "\nstack: ");
    if (end == nullptr) {
      text += what.cStr();
    } else {
      text.append(what.cStr(), end);
    }
    text += '\n';
    flush();
  }